

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O0

Parser * __thiscall
clara::detail::ComposableParserImpl<clara::detail::Opt>::operator|
          (Parser *__return_storage_ptr__,ComposableParserImpl<clara::detail::Opt> *this,Opt *other)

{
  Parser local_e8;
  Parser local_80;
  Opt *local_20;
  Opt *other_local;
  ComposableParserImpl<clara::detail::Opt> *this_local;
  
  local_e8.m_args.super__Vector_base<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.m_args.super__Vector_base<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.m_options.super__Vector_base<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.m_args.super__Vector_base<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.m_options.super__Vector_base<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.m_options.super__Vector_base<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.m_exeName.m_ref.
  super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_e8.m_exeName.m_ref.
  super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8.m_exeName.m_name.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_e8.m_exeName.m_name.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8.super_ParserBase._vptr_ParserBase = (_func_int **)0x0;
  local_e8.m_exeName.super_ComposableParserImpl<clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)(_func_int **)0x0;
  local_20 = other;
  other_local = (Opt *)this;
  this_local = (ComposableParserImpl<clara::detail::Opt> *)__return_storage_ptr__;
  Parser::Parser(&local_e8);
  Parser::operator|(&local_80,&local_e8,(Opt *)this);
  Parser::operator|(__return_storage_ptr__,&local_80,local_20);
  Parser::~Parser(&local_80);
  Parser::~Parser(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

auto ComposableParserImpl<DerivedT>::operator|( T const &other ) const -> Parser {
        return Parser() | static_cast<DerivedT const &>( *this ) | other;
    }